

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_uint mz_zip_writer_compute_padding_needed_for_file_alignment(mz_zip_archive *pZip)

{
  int iVar1;
  uint uVar2;
  
  if (pZip->m_file_offset_alignment != 0) {
    iVar1 = (int)pZip->m_file_offset_alignment;
    uVar2 = iVar1 - 1;
    return iVar1 - ((uint)pZip->m_archive_size & uVar2) & uVar2;
  }
  return 0;
}

Assistant:

static mz_uint
mz_zip_writer_compute_padding_needed_for_file_alignment(mz_zip_archive *pZip) {
  mz_uint32 n;
  if (!pZip->m_file_offset_alignment)
    return 0;
  n = (mz_uint32)(pZip->m_archive_size & (pZip->m_file_offset_alignment - 1));
  return (mz_uint)((pZip->m_file_offset_alignment - n) &
                   (pZip->m_file_offset_alignment - 1));
}